

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O0

bool __thiscall
bssl::ECHServerConfig::SetupContext
          (ECHServerConfig *this,EVP_HPKE_CTX *ctx,uint16_t kdf_id,uint16_t aead_id,
          Span<const_unsigned_char> enc)

{
  int iVar1;
  size_t sVar2;
  cbb_st *pcVar3;
  uchar *puVar4;
  EVP_HPKE_AEAD *pEVar5;
  evp_hpke_key_st *key;
  EVP_HPKE_KDF *kdf;
  uint8_t *info;
  size_t info_len;
  undefined1 local_90 [8];
  ScopedCBB info_cbb;
  uint16_t supported_aead_id;
  uint16_t supported_kdf_id;
  bool cipher_ok;
  undefined1 local_48 [8];
  CBS cbs;
  uint16_t aead_id_local;
  uint16_t kdf_id_local;
  EVP_HPKE_CTX *ctx_local;
  ECHServerConfig *this_local;
  Span<const_unsigned_char> enc_local;
  
  enc_local.data_ = (uchar *)enc.size_;
  this_local = (ECHServerConfig *)enc.data_;
  cbs.len._4_2_ = aead_id;
  cbs.len._6_2_ = kdf_id;
  cbs_st::cbs_st((cbs_st *)local_48,(this->ech_config_).cipher_suites);
  info_cbb.ctx_.u._31_1_ = 0;
  do {
    sVar2 = CBS_len((CBS *)local_48);
    if (sVar2 == 0) goto LAB_00159845;
    iVar1 = CBS_get_u16((CBS *)local_48,(uint16_t *)((long)&info_cbb.ctx_.u + 0x1c));
    if ((iVar1 == 0) ||
       (iVar1 = CBS_get_u16((CBS *)local_48,(uint16_t *)((long)&info_cbb.ctx_.u + 0x1a)), iVar1 == 0
       )) {
      enc_local.size_._7_1_ = 0;
      goto LAB_00159b3d;
    }
  } while ((cbs.len._6_2_ != info_cbb.ctx_.u._28_2_) || (cbs.len._4_2_ != info_cbb.ctx_.u._26_2_));
  info_cbb.ctx_.u._31_1_ = 1;
LAB_00159845:
  if ((info_cbb.ctx_.u._31_1_ & 1) == 0) {
    enc_local.size_._7_1_ = 0;
    goto LAB_00159b3d;
  }
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_90);
  pcVar3 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                     ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_90);
  sVar2 = Array<unsigned_char>::size((Array<unsigned_char> *)this);
  iVar1 = CBB_init(pcVar3,sVar2 + 8);
  if (iVar1 == 0) {
LAB_0015996b:
    enc_local.size_._7_1_ = false;
  }
  else {
    pcVar3 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_90);
    iVar1 = CBB_add_bytes(pcVar3,"tls ech",8);
    if (iVar1 == 0) goto LAB_0015996b;
    pcVar3 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_90);
    puVar4 = Array<unsigned_char>::data((Array<unsigned_char> *)this);
    sVar2 = Array<unsigned_char>::size((Array<unsigned_char> *)this);
    iVar1 = CBB_add_bytes(pcVar3,puVar4,sVar2);
    if (iVar1 == 0) goto LAB_0015996b;
    if (cbs.len._6_2_ != 1) {
      __assert_fail("kdf_id == EVP_HPKE_HKDF_SHA256",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                    ,0x24a,
                    "bool bssl::ECHServerConfig::SetupContext(EVP_HPKE_CTX *, uint16_t, uint16_t, Span<const uint8_t>) const"
                   );
    }
    pEVar5 = get_ech_aead(cbs.len._4_2_);
    if (pEVar5 == (EVP_HPKE_AEAD *)0x0) {
      __assert_fail("get_ech_aead(aead_id) != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                    ,0x24b,
                    "bool bssl::ECHServerConfig::SetupContext(EVP_HPKE_CTX *, uint16_t, uint16_t, Span<const uint8_t>) const"
                   );
    }
    key = internal::
          StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
          ::get(&this->key_);
    kdf = EVP_hpke_hkdf_sha256();
    pEVar5 = get_ech_aead(cbs.len._4_2_);
    puVar4 = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&this_local);
    sVar2 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&this_local);
    pcVar3 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_90);
    info = CBB_data(pcVar3);
    pcVar3 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_90);
    info_len = CBB_len(pcVar3);
    iVar1 = EVP_HPKE_CTX_setup_recipient(ctx,key,kdf,pEVar5,puVar4,sVar2,info,info_len);
    enc_local.size_._7_1_ = iVar1 != 0;
  }
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_90);
LAB_00159b3d:
  return (bool)(enc_local.size_._7_1_ & 1);
}

Assistant:

bool ECHServerConfig::SetupContext(EVP_HPKE_CTX *ctx, uint16_t kdf_id,
                                   uint16_t aead_id,
                                   Span<const uint8_t> enc) const {
  // Check the cipher suite is supported by this ECHServerConfig.
  CBS cbs(ech_config_.cipher_suites);
  bool cipher_ok = false;
  while (CBS_len(&cbs) != 0) {
    uint16_t supported_kdf_id, supported_aead_id;
    if (!CBS_get_u16(&cbs, &supported_kdf_id) ||
        !CBS_get_u16(&cbs, &supported_aead_id)) {
      return false;
    }
    if (kdf_id == supported_kdf_id && aead_id == supported_aead_id) {
      cipher_ok = true;
      break;
    }
  }
  if (!cipher_ok) {
    return false;
  }

  static const uint8_t kInfoLabel[] = "tls ech";
  ScopedCBB info_cbb;
  if (!CBB_init(info_cbb.get(), sizeof(kInfoLabel) + ech_config_.raw.size()) ||
      !CBB_add_bytes(info_cbb.get(), kInfoLabel,
                     sizeof(kInfoLabel) /* includes trailing NUL */) ||
      !CBB_add_bytes(info_cbb.get(), ech_config_.raw.data(),
                     ech_config_.raw.size())) {
    return false;
  }

  assert(kdf_id == EVP_HPKE_HKDF_SHA256);
  assert(get_ech_aead(aead_id) != NULL);
  return EVP_HPKE_CTX_setup_recipient(ctx, key_.get(), EVP_hpke_hkdf_sha256(),
                                      get_ech_aead(aead_id), enc.data(),
                                      enc.size(), CBB_data(info_cbb.get()),
                                      CBB_len(info_cbb.get()));
}